

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

void __thiscall
wasm::OptimizeInstructions::visitStructCmpxchg(OptimizeInstructions *this,StructCmpxchg *curr)

{
  Expression **input;
  uintptr_t uVar1;
  Type type;
  LocalSet *this_00;
  bool bVar2;
  Index IVar3;
  Index index;
  Index index_00;
  BinaryOp op;
  Drop *left;
  Drop *right;
  Block *pBVar4;
  Expression *pEVar5;
  LocalGet *pLVar6;
  StructGet *value;
  LocalGet *value_00;
  StructSet *ifTrue;
  If *item;
  ulong in_RCX;
  ulong extraout_RDX;
  ulong uVar7;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  optional<wasm::Type> type_02;
  initializer_list<wasm::Expression_*> local_88;
  HeapType local_78;
  LocalSet *local_70;
  LocalSet *local_68;
  Block *local_60;
  Index local_58;
  Index local_54;
  Binary *local_50;
  LocalSet *local_48;
  Index local_40;
  Index local_3c;
  Builder local_38;
  Builder builder;
  
  input = &curr->ref;
  skipNonNullCast(this,input,(Expression *)curr);
  bVar2 = trapOnNull(this,(Expression *)curr,input);
  if ((!bVar2) && (bVar2 = wasm::Type::isStruct(&(*input)->type), bVar2)) {
    local_38.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
         ).
         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .currModule;
    local_78 = wasm::Type::getHeapType(&(*input)->type);
    bVar2 = HeapType::isShared(&local_78);
    if ((!bVar2) || (curr->order != SeqCst)) {
      bVar2 = areConsecutiveInputsEqual(this,curr->expected,curr->replacement);
      if (bVar2) {
        pEVar5 = curr->ref;
        left = Builder::makeDrop(&local_38,curr->expected);
        right = Builder::makeDrop(&local_38,curr->replacement);
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_RCX;
        pBVar4 = Builder::makeSequence(&local_38,(Expression *)left,(Expression *)right,type_00);
        pEVar5 = getResultOfFirst(this,pEVar5,(Expression *)pBVar4);
        pBVar4 = (Block *)Builder::makeStructGet
                                    (&local_38,curr->index,pEVar5,curr->order,
                                     (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)69>
                                           ).super_Expression.type.id,false);
      }
      else {
        local_78 = wasm::Type::getHeapType(&(*input)->type);
        bVar2 = HeapType::isShared(&local_78);
        if (bVar2) {
          return;
        }
        IVar3 = Builder::addVar((this->
                                super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                ).
                                super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                .
                                super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                .currFunction,(Type)(curr->ref->type).id);
        local_3c = IVar3;
        index = Builder::addVar((this->
                                super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                ).
                                super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                .
                                super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                .currFunction,
                                (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)69>).
                                      super_Expression.type.id);
        local_50 = (Binary *)CONCAT44(local_50._4_4_,index);
        index_00 = Builder::addVar((this->
                                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                   ).
                                   super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                   .
                                   super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                   .currFunction,
                                   (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)69>).
                                         super_Expression.type.id);
        local_40 = Builder::addVar((this->
                                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                   ).
                                   super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                   .
                                   super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                   .currFunction,
                                   (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)69>).
                                         super_Expression.type.id);
        local_78.id = (uintptr_t)Builder::makeLocalSet(&local_38,IVar3,curr->ref);
        local_70 = Builder::makeLocalSet(&local_38,index,curr->expected);
        local_58 = index_00;
        local_68 = Builder::makeLocalSet(&local_38,index_00,curr->replacement);
        local_88._M_array = (iterator)&local_78;
        local_88._M_len = 3;
        type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)extraout_RDX;
        local_60 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                             (&local_38,&local_88,type_01);
        IVar3 = curr->index;
        uVar1 = (curr->ref->type).id;
        pLVar6 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
        pLVar6->index = local_3c;
        (pLVar6->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar1
        ;
        value = Builder::makeStructGet
                          (&local_38,IVar3,(Expression *)pLVar6,Unordered,
                           (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)69>).
                                 super_Expression.type.id,false);
        local_48 = Builder::makeLocalTee
                             (&local_38,local_40,(Expression *)value,
                              (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)69>).
                                    super_Expression.type.id);
        uVar1 = (curr->super_SpecificExpression<(wasm::Expression::Id)69>).super_Expression.type.id;
        pLVar6 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
        pLVar6->index = (Index)local_50;
        (pLVar6->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar1
        ;
        type.id = (curr->super_SpecificExpression<(wasm::Expression::Id)69>).super_Expression.type.
                  id;
        if ((type.id & 1) == 0 && 6 < type.id) {
          local_50 = (Binary *)
                     Builder::makeRefEq(&local_38,(Expression *)local_48,(Expression *)pLVar6);
        }
        else {
          op = Abstract::getBinary(type,Eq);
          local_50 = Builder::makeBinary(&local_38,op,(Expression *)local_48,(Expression *)pLVar6);
        }
        local_48 = (LocalSet *)&local_60->list;
        local_54 = curr->index;
        uVar1 = (curr->ref->type).id;
        pLVar6 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
        pLVar6->index = local_3c;
        (pLVar6->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar1
        ;
        uVar1 = (curr->super_SpecificExpression<(wasm::Expression::Id)69>).super_Expression.type.id;
        value_00 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
        value_00->index = local_58;
        (value_00->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
             uVar1;
        uVar7 = 0;
        ifTrue = Builder::makeStructSet
                           (&local_38,local_54,(Expression *)pLVar6,(Expression *)value_00,Unordered
                           );
        type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar7;
        item = Builder::makeIf(&local_38,(Expression *)local_50,(Expression *)ifTrue,
                               (Expression *)0x0,type_02);
        this_00 = local_48;
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)local_48,
                   (Expression *)item);
        uVar1 = (curr->super_SpecificExpression<(wasm::Expression::Id)69>).super_Expression.type.id;
        pLVar6 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
        pLVar6->index = local_40;
        (pLVar6->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar1
        ;
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00,
                   (Expression *)pLVar6);
        (((SpecificExpression<(wasm::Expression::Id)66> *)
         &local_60->super_SpecificExpression<(wasm::Expression::Id)1>)->super_Expression).type.id =
             (curr->super_SpecificExpression<(wasm::Expression::Id)69>).super_Expression.type.id;
        pBVar4 = local_60;
      }
      replaceCurrent(this,(Expression *)pBVar4);
    }
  }
  return;
}

Assistant:

void visitStructCmpxchg(StructCmpxchg* curr) {
    skipNonNullCast(curr->ref, curr);
    if (trapOnNull(curr, curr->ref)) {
      return;
    }

    if (!curr->ref->type.isStruct()) {
      return;
    }

    Builder builder(*getModule());

    // As with other RMW operations, we cannot optimize if the RMW is
    // sequentially consistent and to shared memory.
    if (curr->ref->type.getHeapType().isShared() &&
        curr->order == MemoryOrder::SeqCst) {
      return;
    }

    // Just like other RMW operations, unshared or release-acquire cmpxchg can
    // be optimized to just a read if it is known not to change the in-memory
    // value. This is the case when `expected` and `replacement` are known to be
    // the same.
    if (areConsecutiveInputsEqual(curr->expected, curr->replacement)) {
      auto* ref = getResultOfFirst(
        curr->ref,
        builder.makeSequence(builder.makeDrop(curr->expected),
                             builder.makeDrop(curr->replacement)));
      replaceCurrent(
        builder.makeStructGet(curr->index, ref, curr->order, curr->type));
      return;
    }

    if (curr->ref->type.getHeapType().isShared()) {
      return;
    }

    // Just like other RMW operations, lower to basic operations when operating
    // on unshared memory.
    auto ref = builder.addVar(getFunction(), curr->ref->type);
    auto expected = builder.addVar(getFunction(), curr->type);
    auto replacement = builder.addVar(getFunction(), curr->type);
    auto result = builder.addVar(getFunction(), curr->type);
    auto* block =
      builder.makeBlock({builder.makeLocalSet(ref, curr->ref),
                         builder.makeLocalSet(expected, curr->expected),
                         builder.makeLocalSet(replacement, curr->replacement)});
    auto* lhs = builder.makeLocalTee(
      result,
      builder.makeStructGet(curr->index,
                            builder.makeLocalGet(ref, curr->ref->type),
                            MemoryOrder::Unordered,
                            curr->type),
      curr->type);
    auto* rhs = builder.makeLocalGet(expected, curr->type);
    Expression* pred = nullptr;
    if (curr->type.isRef()) {
      pred = builder.makeRefEq(lhs, rhs);
    } else {
      pred = builder.makeBinary(
        Abstract::getBinary(curr->type, Abstract::Eq), lhs, rhs);
    }
    block->list.push_back(builder.makeIf(
      pred,
      builder.makeStructSet(curr->index,
                            builder.makeLocalGet(ref, curr->ref->type),
                            builder.makeLocalGet(replacement, curr->type),
                            MemoryOrder::Unordered)));

    block->list.push_back(builder.makeLocalGet(result, curr->type));
    block->type = curr->type;
    replaceCurrent(block);
  }